

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_io.h
# Opt level: O0

void __thiscall
dmlc::MemoryFixedSizeStream::Write(MemoryFixedSizeStream *this,void *ptr,size_t size)

{
  ostringstream *poVar1;
  ostream *poVar2;
  LogMessageFatal local_1a8;
  size_t local_20;
  size_t size_local;
  void *ptr_local;
  MemoryFixedSizeStream *this_local;
  
  if (size != 0) {
    local_20 = size;
    size_local = (size_t)ptr;
    ptr_local = this;
    if (this->buffer_size_ < this->curr_ptr_ + size) {
      LogMessageFatal::LogMessageFatal
                (&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/memory_io.h"
                 ,0x2c);
      poVar1 = LogMessageFatal::stream_abi_cxx11_(&local_1a8);
      poVar2 = std::operator<<((ostream *)poVar1,"Check failed: curr_ptr_ + size <= buffer_size_");
      std::operator<<(poVar2,": ");
      LogMessageFatal::~LogMessageFatal(&local_1a8);
    }
    memcpy(this->p_buffer_ + this->curr_ptr_,(void *)size_local,local_20);
    this->curr_ptr_ = local_20 + this->curr_ptr_;
  }
  return;
}

Assistant:

virtual void Write(const void *ptr, size_t size) {
    if (size == 0)
      return;
    CHECK(curr_ptr_ + size <= buffer_size_);
    std::memcpy(p_buffer_ + curr_ptr_, ptr, size);
    curr_ptr_ += size;
  }